

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall args::Command::UpdateSubparserHelp(Command *this,HelpParams *params)

{
  bool bVar1;
  Subparser *__args;
  SubparserError *anon_var_0;
  undefined1 local_e0 [8];
  RaiiSubparser coro;
  HelpParams *params_local;
  Command *this_local;
  
  coro.oldSubparser = (Subparser *)params;
  bVar1 = std::function::operator_cast_to_bool((function *)&this->parserCoroutine);
  if (bVar1) {
    RaiiSubparser::RaiiSubparser((RaiiSubparser *)local_e0,this,(HelpParams *)coro.oldSubparser);
    __args = RaiiSubparser::Parser((RaiiSubparser *)local_e0);
    std::function<void_(args::Subparser_&)>::operator()(&this->parserCoroutine,__args);
    RaiiSubparser::~RaiiSubparser((RaiiSubparser *)local_e0);
  }
  return;
}

Assistant:

void UpdateSubparserHelp(const HelpParams &params) const
            {
                if (parserCoroutine)
                {
                    RaiiSubparser coro(*this, params);
#ifndef ARGS_NOEXCEPT
                    try
                    {
                        parserCoroutine(coro.Parser());
                    }
                    catch (args::SubparserError&)
                    {
                    }
#else
                    parserCoroutine(coro.Parser());
#endif
                }
            }